

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

void ParseError(UniValue *error,string *strPrint,int *nRet)

{
  int iVar1;
  int iVar2;
  UniValue *pUVar3;
  UniValue *this;
  string *__rhs;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  local_38 = *(pointer *)(in_FS_OFFSET + 0x28);
  if (error->typ == VOBJ) {
    key._M_str = "code";
    key._M_len = 4;
    pUVar3 = UniValue::find_value(error,key);
    key_00._M_str = "message";
    key_00._M_len = 7;
    this = UniValue::find_value(error,key_00);
    if (pUVar3->typ != VNULL) {
      std::operator+(&bStack_78,"error code: ",&pUVar3->val);
      std::operator+(&local_58,&bStack_78,"\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (strPrint,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&bStack_78);
    }
    if (this->typ == VSTR) {
      __rhs = UniValue::get_str_abi_cxx11_(this);
      std::operator+(&local_58,"error message:\n",__rhs);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (strPrint,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    if (pUVar3->typ == VNUM) {
      iVar1 = UniValue::getInt<int>(pUVar3);
      if (iVar1 == -0x13) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (strPrint,
                   "\nTry adding \"-rpcwallet=<filename>\" option to bitcoin-cli command line.");
      }
    }
  }
  else {
    UniValue::write_abi_cxx11_((UniValue *)&bStack_78,(int)error,(void *)0x0,0);
    std::operator+(&local_58,"error: ",&bStack_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (strPrint,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&bStack_78);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"code",(allocator<char> *)&bStack_78);
  pUVar3 = UniValue::operator[](error,&local_58);
  iVar2 = UniValue::getInt<int>(pUVar3);
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  *nRet = iVar1;
  std::__cxx11::string::~string((string *)&local_58);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void ParseError(const UniValue& error, std::string& strPrint, int& nRet)
{
    if (error.isObject()) {
        const UniValue& err_code = error.find_value("code");
        const UniValue& err_msg = error.find_value("message");
        if (!err_code.isNull()) {
            strPrint = "error code: " + err_code.getValStr() + "\n";
        }
        if (err_msg.isStr()) {
            strPrint += ("error message:\n" + err_msg.get_str());
        }
        if (err_code.isNum() && err_code.getInt<int>() == RPC_WALLET_NOT_SPECIFIED) {
            strPrint += "\nTry adding \"-rpcwallet=<filename>\" option to bitcoin-cli command line.";
        }
    } else {
        strPrint = "error: " + error.write();
    }
    nRet = abs(error["code"].getInt<int>());
}